

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

Matrix44<float> * __thiscall
Imath_3_2::Matrix44<float>::gjInverse(Matrix44<float> *this,bool singExc)

{
  invalid_argument *piVar1;
  byte in_DL;
  Matrix44<float> *in_RSI;
  Matrix44<float> *in_RDI;
  float fVar2;
  float f_1;
  float f;
  float tmp_1;
  float tmp;
  float pivotsize;
  int pivot;
  Matrix44<float> t;
  Matrix44<float> s;
  int k;
  int j;
  int i;
  float local_ac;
  float local_a8;
  int local_a4;
  Matrix44<float> local_a0;
  Matrix44<float> local_60;
  int local_20;
  int local_1c;
  int local_18;
  byte local_11;
  
  local_11 = in_DL & 1;
  Matrix44(&local_60);
  Matrix44(&local_a0,in_RSI);
  for (local_18 = 0; local_18 < 3; local_18 = local_18 + 1) {
    local_a4 = local_18;
    local_a8 = local_a0.x[local_18][local_18];
    if (local_a8 < 0.0) {
      local_a8 = -local_a8;
    }
    for (local_1c = local_18 + 1; local_1c < 4; local_1c = local_1c + 1) {
      local_ac = local_a0.x[local_1c][local_18];
      if (local_ac < 0.0) {
        local_ac = -local_ac;
      }
      if (local_a8 < local_ac) {
        local_a4 = local_1c;
        local_a8 = local_ac;
      }
    }
    if ((local_a8 == 0.0) && (!NAN(local_a8))) {
      if ((local_11 & 1) == 0) {
        Matrix44(in_RDI);
        return in_RDI;
      }
      piVar1 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar1,"Cannot invert singular matrix.");
      __cxa_throw(piVar1,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    if (local_a4 != local_18) {
      for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
        fVar2 = local_a0.x[local_18][local_1c];
        local_a0.x[local_18][local_1c] = local_a0.x[local_a4][local_1c];
        local_a0.x[local_a4][local_1c] = fVar2;
        fVar2 = local_60.x[local_18][local_1c];
        local_60.x[local_18][local_1c] = local_60.x[local_a4][local_1c];
        local_60.x[local_a4][local_1c] = fVar2;
      }
    }
    for (local_1c = local_18 + 1; local_1c < 4; local_1c = local_1c + 1) {
      fVar2 = local_a0.x[local_1c][local_18] / local_a0.x[local_18][local_18];
      for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
        local_a0.x[local_1c][local_20] =
             -fVar2 * local_a0.x[local_18][local_20] + local_a0.x[local_1c][local_20];
        local_60.x[local_1c][local_20] =
             -fVar2 * local_60.x[local_18][local_20] + local_60.x[local_1c][local_20];
      }
    }
  }
  local_18 = 3;
  while( true ) {
    if (local_18 < 0) {
      Matrix44(in_RDI,&local_60);
      return in_RDI;
    }
    fVar2 = local_a0.x[local_18][local_18];
    if ((fVar2 == 0.0) && (!NAN(fVar2))) break;
    for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
      local_a0.x[local_18][local_1c] = local_a0.x[local_18][local_1c] / fVar2;
      local_60.x[local_18][local_1c] = local_60.x[local_18][local_1c] / fVar2;
    }
    for (local_1c = 0; local_1c < local_18; local_1c = local_1c + 1) {
      fVar2 = local_a0.x[local_1c][local_18];
      for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
        local_a0.x[local_1c][local_20] =
             -fVar2 * local_a0.x[local_18][local_20] + local_a0.x[local_1c][local_20];
        local_60.x[local_1c][local_20] =
             -fVar2 * local_60.x[local_18][local_20] + local_60.x[local_1c][local_20];
      }
    }
    local_18 = local_18 + -1;
  }
  if ((local_11 & 1) == 0) {
    Matrix44(in_RDI);
    return in_RDI;
  }
  piVar1 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar1,"Cannot invert singular matrix.");
  __cxa_throw(piVar1,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

inline Matrix44<T>
Matrix44<T>::gjInverse (bool singExc) const
{
    int      i, j, k;
    Matrix44 s;
    Matrix44 t (*this);

    // Forward elimination

    for (i = 0; i < 3; i++)
    {
        int pivot = i;

        T pivotsize = t.x[i][i];

        if (pivotsize < 0) pivotsize = -pivotsize;

        for (j = i + 1; j < 4; j++)
        {
            T tmp = t.x[j][i];

            if (tmp < 0) tmp = -tmp;

            if (tmp > pivotsize)
            {
                pivot     = j;
                pivotsize = tmp;
            }
        }

        if (pivotsize == 0)
        {
            if (singExc)
                throw std::invalid_argument ("Cannot invert singular matrix.");

            return Matrix44 ();
        }

        if (pivot != i)
        {
            for (j = 0; j < 4; j++)
            {
                T tmp;

                tmp           = t.x[i][j];
                t.x[i][j]     = t.x[pivot][j];
                t.x[pivot][j] = tmp;

                tmp           = s.x[i][j];
                s.x[i][j]     = s.x[pivot][j];
                s.x[pivot][j] = tmp;
            }
        }

        for (j = i + 1; j < 4; j++)
        {
            T f = t.x[j][i] / t.x[i][i];

            for (k = 0; k < 4; k++)
            {
                t.x[j][k] -= f * t.x[i][k];
                s.x[j][k] -= f * s.x[i][k];
            }
        }
    }

    // Backward substitution

    for (i = 3; i >= 0; --i)
    {
        T f;

        if ((f = t.x[i][i]) == 0)
        {
            if (singExc)
                throw std::invalid_argument ("Cannot invert singular matrix.");

            return Matrix44 ();
        }

        for (j = 0; j < 4; j++)
        {
            t.x[i][j] /= f;
            s.x[i][j] /= f;
        }

        for (j = 0; j < i; j++)
        {
            f = t.x[j][i];

            for (k = 0; k < 4; k++)
            {
                t.x[j][k] -= f * t.x[i][k];
                s.x[j][k] -= f * s.x[i][k];
            }
        }
    }

    return s;
}